

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputIterator.hpp
# Opt level: O0

vector<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>_>_>
* __thiscall
supermap::io::
InputIterator<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<4ul>>,unsigned_int,6ul,void>
::
collectWith<_DOCTEST_ANON_SUITE_2::_DOCTEST_ANON_FUNC_37()::__0,supermap::KeyValue<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<4ul>>,unsigned_int>>
          (void *param_1,size_type param_2,uint param_3)

{
  undefined1 auVar1 [16];
  pointer pIVar2;
  KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_> *kv;
  uint *puVar3;
  vector<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>_>_>
  *this;
  pointer pcVar4;
  value_type *__x;
  uint objectI;
  stringstream iss;
  unique_ptr<char[],_std::default_delete<char[]>_> bytes;
  uint64_t bytesToRead;
  uint objectsToRead;
  size_t bytes_1;
  uint objectsInStream;
  vector<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>_>_>
  *collection;
  unique_ptr<char[],_std::default_delete<char[]>_> *in_stack_fffffffffffffda0;
  vector<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>_>_>
  *this_00;
  void *__num;
  anon_class_1_0_00000001 *in_stack_fffffffffffffdd8;
  uint local_200;
  allocator local_1f9;
  string local_1f8 [32];
  stringstream local_1d8 [400];
  vector<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>_>_>
  *local_48;
  uint local_40;
  KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_> *local_30;
  uint local_24;
  byte local_1d;
  uint local_1c;
  size_type local_18;
  void *local_8;
  
  local_1d = 0;
  __num = param_1;
  local_1c = param_3;
  local_18 = param_2;
  local_8 = param_1;
  std::
  vector<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>_>_>
  ::vector((vector<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>_>_>
            *)0x139595);
  pIVar2 = std::
           unique_ptr<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>::
           operator->((unique_ptr<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>
                       *)0x13959f);
  kv = (KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_> *)
       (**(code **)(*(long *)pIVar2 + 8))();
  auVar1._8_8_ = 0;
  auVar1._0_8_ = kv;
  local_40 = SUB164(auVar1 / ZEXT816(6),0);
  local_30 = kv;
  local_24 = local_40;
  if (local_1c != 0) {
    puVar3 = std::min<unsigned_int>(&local_24,&local_1c);
    local_40 = *puVar3;
  }
  std::
  vector<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>_>_>
  ::reserve((vector<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>_>_>
             *)kv,param_2);
  local_48 = (vector<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>_>_>
              *)((ulong)local_40 * 6);
  std::make_unique<char[]>((size_t)__num);
  pIVar2 = std::
           unique_ptr<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>::
           operator->((unique_ptr<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>
                       *)0x139675);
  this = (vector<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>_>_>
          *)(*(code *)**(undefined8 **)pIVar2)();
  pcVar4 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(in_stack_fffffffffffffda0);
  std::istream::read((char *)this,(long)pcVar4);
  __x = (value_type *)
        std::unique_ptr<char[],_std::default_delete<char[]>_>::get(in_stack_fffffffffffffda0);
  this_00 = local_48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,(char *)__x,(ulong)this_00,&local_1f9);
  std::__cxx11::stringstream::stringstream(local_1d8,local_1f8,_S_in);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  for (local_200 = 0; local_200 < local_40; local_200 = local_200 + 1) {
    deserialize<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<4ul>>,void>
              ((istream *)__x);
    *(int *)(param_2 + 8) = *(int *)(param_2 + 8) + 1;
    _DOCTEST_ANON_SUITE_2::_DOCTEST_ANON_FUNC_37::anon_class_1_0_00000001::operator()
              (in_stack_fffffffffffffdd8,kv,(uint32_t)(param_2 >> 0x20));
    std::
    vector<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>_>_>
    ::push_back(this_00,__x);
    KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>::
    ~KeyValue((KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>
               *)0x13978f);
    KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>::~KeyValue
              ((KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_> *)0x139799);
  }
  local_1d = 1;
  std::__cxx11::stringstream::~stringstream(local_1d8);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)this_00);
  if ((local_1d & 1) == 0) {
    std::
    vector<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>_>_>
    ::~vector(this);
  }
  return (vector<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>,_std::allocator<supermap::KeyValue<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int>_>_>
          *)param_1;
}

Assistant:

std::vector<Result> collectWith(Functor functor, IndexT collectionSizeLimit = 0) {
        std::vector<Result> collection;
        IndexT objectsInStream;
        {
            auto bytes = input_->availableBytes();
            assert(bytes % EachSize == 0);
            objectsInStream = bytes / EachSize;
        }
        IndexT objectsToRead;
        if (collectionSizeLimit == 0) {
            objectsToRead = objectsInStream;
        } else {
            objectsToRead = std::min(objectsInStream, collectionSizeLimit);
        }
        collection.reserve(objectsToRead);
        const std::uint64_t bytesToRead = static_cast<std::uint64_t>(objectsToRead) * EachSize;
        std::unique_ptr<char[]> bytes = std::make_unique<char[]>(bytesToRead);
        input_->get().read(bytes.get(), bytesToRead);
        std::stringstream iss(std::string(bytes.get(), bytesToRead), std::ios_base::in);
        for (IndexT objectI = 0; objectI < objectsToRead; ++objectI) {
            collection.push_back(functor(deserialize<T>(iss), index_++));
        }
        return collection;
    }